

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

vector<PYSTRINGTest_*,_std::allocator<PYSTRINGTest_*>_> * GetUnitTests(void)

{
  int iVar1;
  
  if ((GetUnitTests()::pystring_unit_tests == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GetUnitTests()::pystring_unit_tests), iVar1 != 0)) {
    GetUnitTests::pystring_unit_tests.
    super__Vector_base<PYSTRINGTest_*,_std::allocator<PYSTRINGTest_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    GetUnitTests::pystring_unit_tests.
    super__Vector_base<PYSTRINGTest_*,_std::allocator<PYSTRINGTest_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    GetUnitTests::pystring_unit_tests.
    super__Vector_base<PYSTRINGTest_*,_std::allocator<PYSTRINGTest_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __cxa_atexit(std::vector<PYSTRINGTest_*,_std::allocator<PYSTRINGTest_*>_>::~vector,
                 &GetUnitTests::pystring_unit_tests,&__dso_handle);
    __cxa_guard_release(&GetUnitTests()::pystring_unit_tests);
  }
  return &GetUnitTests::pystring_unit_tests;
}

Assistant:

PYSTRING_ADD_TEST(pystring, endswith)
{
    PYSTRING_CHECK_EQUAL(pystring::endswith("", ""), true);
    PYSTRING_CHECK_EQUAL(pystring::endswith("", "a"), false);
    PYSTRING_CHECK_EQUAL(pystring::endswith("a", ""), true);
    PYSTRING_CHECK_EQUAL(pystring::endswith("", ".mesh"), false);
    PYSTRING_CHECK_EQUAL(pystring::endswith("help", ".mesh"), false);
    PYSTRING_CHECK_EQUAL(pystring::endswith("help", ".mesh", 0), false);
    PYSTRING_CHECK_EQUAL(pystring::endswith("help", ".mesh", 1), false);
    PYSTRING_CHECK_EQUAL(pystring::endswith("help", ".mesh", 1, 2), false);
    PYSTRING_CHECK_EQUAL(pystring::endswith("help", ".mesh", 1, 1), false);
    PYSTRING_CHECK_EQUAL(pystring::endswith("help", ".mesh", 1, -1), false);
    PYSTRING_CHECK_EQUAL(pystring::endswith("help", ".mesh", -1), false);
    PYSTRING_CHECK_EQUAL(pystring::endswith(".mesh", ".mesh"), true);
    PYSTRING_CHECK_EQUAL(pystring::endswith("a.mesh", ".mesh"), true);
    PYSTRING_CHECK_EQUAL(pystring::endswith("a.", "."), true);
    PYSTRING_CHECK_EQUAL(pystring::endswith("abcdef", "ef"), true);
    PYSTRING_CHECK_EQUAL(pystring::endswith("abcdef", "cdef"), true);
    PYSTRING_CHECK_EQUAL(pystring::endswith("abcdef", "cdef", 2), true);
    PYSTRING_CHECK_EQUAL(pystring::endswith("abcdef", "cdef", 3), false);
    PYSTRING_CHECK_EQUAL(pystring::endswith("abcdef", "cdef", 2, 3), false);
    PYSTRING_CHECK_EQUAL(pystring::endswith("abcdef", "cdef", -10), true);
}